

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipMessage(CodedInputStream *input)

{
  bool bVar1;
  uint32 tag_00;
  WireType WVar2;
  CodedInputStream *in_RDI;
  WireType wire_type;
  uint32 tag;
  uint32 v;
  CodedInputStream *in_stack_00000038;
  CodedInputStream *pCVar3;
  uint32 tag_01;
  undefined4 in_stack_ffffffffffffffe8;
  
  do {
    if ((in_RDI->buffer_ < in_RDI->buffer_end_) &&
       (tag_00 = (uint32)*in_RDI->buffer_, tag_00 < 0x80)) {
      pCVar3 = in_RDI;
      io::CodedInputStream::Advance(in_RDI,1);
      tag_01 = (uint32)((ulong)pCVar3 >> 0x20);
    }
    else {
      pCVar3 = in_RDI;
      tag_00 = io::CodedInputStream::ReadTagFallback(in_stack_00000038,v);
      tag_01 = (uint32)((ulong)pCVar3 >> 0x20);
    }
    in_RDI->last_tag_ = tag_00;
    if (tag_00 == 0) {
      return true;
    }
    WVar2 = GetTagWireType(tag_00);
    if (WVar2 == WIRETYPE_END_GROUP) {
      return true;
    }
    bVar1 = SkipField((CodedInputStream *)CONCAT44(tag_00,in_stack_ffffffffffffffe8),tag_01);
  } while (bVar1);
  return false;
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag)) return false;
  }
}